

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_device_stop__jack(ma_device *pDevice)

{
  ma_context *pmVar1;
  int iVar2;
  ma_result mVar3;
  
  iVar2 = (*(pDevice->pContext->field_21).alsa.snd_pcm_hw_params_set_buffer_size_near)
                    ((pDevice->field_23).alsa.pPCMPlayback);
  if (iVar2 == 0) {
    mVar3 = 0;
    if (pDevice->onStop != (ma_stop_proc)0x0) {
      (*pDevice->onStop)(pDevice);
      mVar3 = 0;
    }
  }
  else {
    pmVar1 = pDevice->pContext;
    mVar3 = -1;
    if ((pmVar1 != (ma_context *)0x0) && (pmVar1->logCallback != (ma_log_proc)0x0)) {
      (*pmVar1->logCallback)
                (pmVar1,pDevice,1,"[JACK] An error occurred when deactivating the JACK client.");
    }
  }
  return mVar3;
}

Assistant:

static ma_result ma_device_stop__jack(ma_device* pDevice)
{
    ma_context* pContext = pDevice->pContext;
    ma_stop_proc onStop;

    if (((ma_jack_deactivate_proc)pContext->jack.jack_deactivate)((ma_jack_client_t*)pDevice->jack.pClient) != 0) {
        return ma_post_error(pDevice, MA_LOG_LEVEL_ERROR, "[JACK] An error occurred when deactivating the JACK client.", MA_ERROR);
    }
    
    onStop = pDevice->onStop;
    if (onStop) {
        onStop(pDevice);
    }

    return MA_SUCCESS;
}